

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsqlquerymodel_p.h
# Opt level: O2

int QSqlQueryModelSql::select
              (int __nfds,fd_set *__readfds,fd_set *__writefds,fd_set *__exceptfds,
              timeval *__timeout)

{
  int iVar1;
  undefined4 extraout_var;
  char *extraout_RDX;
  undefined4 in_register_0000003c;
  long in_FS_OFFSET;
  QLatin1StringView latin1;
  QArrayDataPointer<char16_t> QStack_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  iVar1 = select(__nfds,__readfds,__writefds,__exceptfds,__timeout);
  latin1.m_size._4_4_ = extraout_var;
  latin1.m_size._0_4_ = iVar1;
  latin1.m_data = extraout_RDX;
  QString::QString((QString *)&QStack_38,latin1);
  concat((QString *)CONCAT44(in_register_0000003c,__nfds),(QString *)&QStack_38,(QString *)__readfds
        );
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&QStack_38);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return __nfds;
  }
  __stack_chk_fail();
}

Assistant:

inline const static QString select(const QString &s) { return concat(select(), s); }